

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glib_compat.c
# Opt level: O2

char * g_strdup_vprintf(char *format,__va_list_tag *ap)

{
  int iVar1;
  char *str_res;
  char *local_8;
  
  local_8 = (char *)0x0;
  iVar1 = vasprintf(&local_8,format,ap);
  if (iVar1 == -1) {
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

char *g_strdup_vprintf(const char *format, va_list ap)
{
    char *str_res = NULL;
#ifdef _MSC_VER
    int len = _vscprintf(format, ap);
    if( len < 0 )
        return NULL;
    str_res = (char *)malloc(len+1);
    if(str_res==NULL)
        return NULL;
    vsnprintf(str_res, len+1, format, ap);
#else
    int ret = vasprintf(&str_res, format, ap);
    if (ret == -1) {
        return NULL;
    }
#endif
    return str_res;
}